

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Asset.h
# Opt level: O2

void __thiscall glTF2::PbrSpecularGlossiness::PbrSpecularGlossiness(PbrSpecularGlossiness *this)

{
  (this->diffuseTexture).texture.vector =
       (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)0x0;
  (this->diffuseTexture).texture.index = 0;
  (this->diffuseTexture).texCoord = 0;
  (this->diffuseTexture).textureTransformSupported = false;
  (this->specularGlossinessTexture).texture.vector =
       (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)0x0;
  (this->specularGlossinessTexture).texture.index = 0;
  (this->specularGlossinessTexture).texCoord = 0;
  (this->specularGlossinessTexture).textureTransformSupported = false;
  SetDefaults(this);
  return;
}

Assistant:

Ref() : vector(0), index(0) {}